

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.c
# Opt level: O3

int version_compare4(char *v1,char *v2,int v1_flags,int v2_flags)

{
  component_t *pcVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  undefined4 uVar5;
  int iVar6;
  size_t sVar7;
  size_t sVar8;
  component_t *pcVar9;
  component_t *pcVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  component_t v2_components [2];
  component_t v1_components [2];
  char *local_a8;
  char *local_a0;
  component_t local_98 [2];
  component_t local_68 [2];
  
  bVar15 = (v1_flags & 0xcU) != 0;
  bVar16 = (v2_flags & 0xcU) != 0;
  sVar8 = 0;
  sVar7 = 0;
  local_a8 = v2;
  local_a0 = v1;
  do {
    pcVar9 = local_68;
    if (sVar7 == 0) {
      sVar7 = get_next_version_component(&local_a0,pcVar9,v1_flags);
    }
    if (sVar8 == 0) {
      sVar8 = get_next_version_component(&local_a8,local_98,v2_flags);
    }
    uVar11 = sVar8;
    if (sVar7 < sVar8) {
      uVar11 = sVar7;
    }
    if (uVar11 != 0) {
      pcVar10 = local_98;
      uVar14 = uVar11;
      do {
        iVar6 = compare_components(pcVar9,pcVar10);
        if (iVar6 != 0) {
          return iVar6;
        }
        pcVar10 = pcVar10 + 1;
        pcVar9 = pcVar9 + 1;
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
      pcVar9 = local_68;
      if (sVar7 != sVar8) {
        pcVar10 = local_98;
        uVar14 = uVar11;
        do {
          pcVar9->end = pcVar9[uVar11].end;
          pcVar1 = pcVar9 + uVar11;
          uVar5 = *(undefined4 *)&pcVar1->field_0x4;
          pcVar4 = pcVar1->start;
          pcVar9->metaorder = pcVar1->metaorder;
          *(undefined4 *)&pcVar9->field_0x4 = uVar5;
          pcVar9->start = pcVar4;
          pcVar10->end = pcVar10[uVar11].end;
          pcVar1 = pcVar10 + uVar11;
          uVar5 = *(undefined4 *)&pcVar1->field_0x4;
          pcVar4 = pcVar1->start;
          pcVar10->metaorder = pcVar1->metaorder;
          *(undefined4 *)&pcVar10->field_0x4 = uVar5;
          pcVar10->start = pcVar4;
          pcVar10 = pcVar10 + 1;
          pcVar9 = pcVar9 + 1;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
    }
    sVar7 = sVar7 - uVar11;
    bVar12 = sVar7 == 0 && *local_a0 == '\0';
    sVar8 = sVar8 - uVar11;
    bVar3 = sVar8 == 0 && *local_a8 == '\0';
    bVar13 = bVar15 && bVar12;
    if (bVar15 && (sVar7 == 0 && *local_a0 == '\0')) {
      bVar15 = false;
    }
    bVar2 = bVar16 && bVar3;
    if (bVar16 && (sVar8 == 0 && *local_a8 == '\0')) {
      bVar16 = false;
    }
  } while ((bVar12 == bVar13) || (bVar3 == bVar2));
  return 0;
}

Assistant:

int version_compare4(const char* v1, const char* v2, int v1_flags, int v2_flags) {
	component_t v1_components[2], v2_components[2];
	size_t v1_len = 0, v2_len = 0;
	size_t shift, i;

	int v1_extra_components = (v1_flags & (VERSIONFLAG_LOWER_BOUND|VERSIONFLAG_UPPER_BOUND)) ? 1 : 0;
	int v2_extra_components = (v2_flags & (VERSIONFLAG_LOWER_BOUND|VERSIONFLAG_UPPER_BOUND)) ? 1 : 0;

	int v1_exhausted, v2_exhausted;

	int res;

	do {
		if (v1_len == 0)
			v1_len = get_next_version_component(&v1, v1_components, v1_flags);
		if (v2_len == 0)
			v2_len = get_next_version_component(&v2, v2_components, v2_flags);

		shift = MY_MIN(v1_len, v2_len);
		for (i = 0; i < shift; i++) {
			res = compare_components(&v1_components[i], &v2_components[i]);
			if (res != 0)
				return res;
		}

		if (v1_len != v2_len) {
			for (i = 0; i < shift; i++) {
				v1_components[i] = v1_components[i+shift];
				v2_components[i] = v2_components[i+shift];
			}
		}

		v1_len -= shift;
		v2_len -= shift;

		v1_exhausted = *v1 == '\0' && v1_len == 0;
		v2_exhausted = *v2 == '\0' && v2_len == 0;

		if (v1_exhausted && v1_extra_components > 0) {
			v1_extra_components--;
			v1_exhausted = 0;
		}
		if (v2_exhausted && v2_extra_components > 0) {
			v2_extra_components--;
			v2_exhausted = 0;
		}
	} while (!v1_exhausted || !v2_exhausted);

	return 0;
}